

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32 tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint *puVar3;
  float *pfVar4;
  uint8 *puVar5;
  int32 *piVar6;
  uint32 *puVar7;
  bool bVar8;
  uint uVar9;
  Limit limit;
  int iVar10;
  UnknownFieldSet *pUVar11;
  double *pdVar12;
  unsigned_long uVar13;
  Message *pMVar14;
  int64 iVar15;
  uint64 value;
  undefined4 extraout_var;
  EnumDescriptor *this;
  EnumValueDescriptor *value_00;
  int32 value_01;
  _Alloc_hider _Var16;
  ulong uVar17;
  Reflection *this_00;
  uint32 uVar18;
  int key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  float fVar20;
  pair<unsigned_long,_bool> pVar21;
  uint32 temp;
  string local_e0;
  Limit local_bc;
  FieldDescriptor *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  if (field == (FieldDescriptor *)0x0) goto LAB_0037d367;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_e0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b8 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_e0,&local_b8)
    ;
  }
  uVar9 = *(uint *)(field + 0x38);
  if ((tag & 7) != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)uVar9 * 4)) {
    if (*(int *)(field + 0x3c) != 3) {
LAB_0037d367:
      pUVar11 = Reflection::MutableUnknownFields(this_00,message);
      bVar8 = SkipField(input,tag,pUVar11);
      return bVar8;
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_e0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_e0,
                 &local_b8);
      uVar9 = *(uint *)(field + 0x38);
    }
    if (((tag & 7) != 2) || (0xfffffffb < uVar9 - 0xd)) goto LAB_0037d367;
    pbVar2 = input->buffer_;
    if (pbVar2 < input->buffer_end_) {
      uVar9 = (uint)*pbVar2;
      if ((char)*pbVar2 < '\0') goto LAB_0037d958;
      input->buffer_ = pbVar2 + 1;
    }
    else {
      uVar9 = 0;
LAB_0037d958:
      iVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      uVar9 = (uint)iVar15;
      if (iVar15 < 0) {
        return false;
      }
    }
    limit = io::CodedInputStream::PushLimit(input,uVar9);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_e0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_e0,
                 &local_b8);
    }
    switch(*(undefined4 *)(field + 0x38)) {
    case 1:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pdVar12 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar12 < 8) {
            bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e0);
            _Var16._M_p = local_e0._M_dataplus._M_p;
            if (!bVar8) {
              return false;
            }
          }
          else {
            _Var16._M_p = (pointer)*pdVar12;
            input->buffer_ = (uint8 *)(pdVar12 + 1);
          }
          Reflection::AddDouble(this_00,message,field,(double)_Var16._M_p);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case 2:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e0);
            if (!bVar8) {
              return false;
            }
            fVar20 = local_e0._M_dataplus._M_p._0_4_;
          }
          else {
            fVar20 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          Reflection::AddFloat(this_00,message,field,fVar20);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case 3:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar13 = (unsigned_long)(char)*puVar5, -1 < (long)uVar13)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar13 = pVar21.first;
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddInt64(this_00,message,field,uVar13);
      }
      break;
    case 4:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (value = (uint64)(char)*puVar5, -1 < (long)value)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
          value = pVar21.first;
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddUInt64(this_00,message,field,value);
      }
      break;
    case 5:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar17 = (ulong)bVar1;
          uVar18 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0037dbd6;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar18 = 0;
LAB_0037dbd6:
          uVar17 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
          if ((long)uVar17 < 0) {
            return false;
          }
        }
        Reflection::AddInt32(this_00,message,field,(int32)uVar17);
      }
      break;
    case 6:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pdVar12 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar12 < 8) {
            bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e0);
            if (!bVar8) {
              return false;
            }
          }
          else {
            local_e0._M_dataplus._M_p = (pointer)*pdVar12;
            input->buffer_ = (uint8 *)(pdVar12 + 1);
          }
          Reflection::AddUInt64(this_00,message,field,(uint64)local_e0._M_dataplus._M_p);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case 7:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          puVar7 = (uint32 *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar7 < 4) {
            bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e0);
            if (!bVar8) {
              return false;
            }
            uVar18 = (uint32)local_e0._M_dataplus._M_p._0_4_;
          }
          else {
            uVar18 = *puVar7;
            local_e0._M_dataplus._M_p._0_4_ = (float)uVar18;
            input->buffer_ = (uint8 *)(puVar7 + 1);
          }
          Reflection::AddUInt32(this_00,message,field,uVar18);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case 8:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar13 = (unsigned_long)(char)*puVar5, -1 < (long)uVar13)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar13 = pVar21.first;
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddBool(this_00,message,field,uVar13 != 0);
      }
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      goto LAB_0037df5e;
    case 0xd:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar17 = (ulong)bVar1;
          uVar18 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0037da86;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar18 = 0;
LAB_0037da86:
          uVar17 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
          if ((long)uVar17 < 0) {
            return false;
          }
        }
        Reflection::AddUInt32(this_00,message,field,(uint32)uVar17);
      }
      break;
    case 0xe:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        local_bc = limit;
        do {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar17 = (ulong)bVar1;
            uVar18 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_0037de54;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar18 = 0;
LAB_0037de54:
            uVar17 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
            if ((long)uVar17 < 0) {
              return false;
            }
          }
          iVar10 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
          key = (int)uVar17;
          if (*(int *)(*(long *)(CONCAT44(extraout_var,iVar10) + 0x10) + 0x3c) == 3) {
            Reflection::AddEnumValue(this_00,message,field,key);
          }
          else {
            this = FieldDescriptor::enum_type(field);
            value_00 = EnumDescriptor::FindValueByNumber(this,key);
            if (value_00 == (EnumValueDescriptor *)0x0) {
              pUVar11 = Reflection::MutableUnknownFields(this_00,message);
              UnknownFieldSet::AddVarint(pUVar11,tag >> 3,(long)key);
            }
            else {
              Reflection::AddEnum(this_00,message,field,value_00);
            }
          }
          limit = local_bc;
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case 0xf:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          piVar6 = (int32 *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)piVar6 < 4) {
            bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e0);
            if (!bVar8) {
              return false;
            }
            value_01 = (int32)local_e0._M_dataplus._M_p._0_4_;
          }
          else {
            value_01 = *piVar6;
            input->buffer_ = (uint8 *)(piVar6 + 1);
          }
          Reflection::AddInt32(this_00,message,field,value_01);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case 0x10:
      iVar10 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar10) {
        do {
          pdVar12 = (double *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pdVar12 < 8) {
            bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e0);
            _Var16._M_p = local_e0._M_dataplus._M_p;
            if (!bVar8) {
              return false;
            }
          }
          else {
            _Var16._M_p = (pointer)*pdVar12;
            input->buffer_ = (uint8 *)(pdVar12 + 1);
          }
          Reflection::AddInt64(this_00,message,field,(int64)_Var16._M_p);
          iVar10 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar10);
      }
      break;
    case 0x11:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar17 = (ulong)bVar1;
          uVar18 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0037d9d9;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar18 = 0;
LAB_0037d9d9:
          uVar17 = io::CodedInputStream::ReadVarint32Fallback(input,uVar18);
          if ((long)uVar17 < 0) {
            return false;
          }
        }
        Reflection::AddInt32
                  (this_00,message,field,-((uint)uVar17 & 1) ^ (uint)(uVar17 >> 1) & 0x7fffffff);
      }
      break;
    case 0x12:
      while (iVar10 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar10) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar17 = (ulong)(char)*puVar5, -1 < (long)uVar17)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar17 = pVar21.first;
          if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        Reflection::AddInt64(this_00,message,field,-(ulong)((uint)uVar17 & 1) ^ uVar17 >> 1);
      }
    }
    io::CodedInputStream::PopLimit(input,limit);
    return true;
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_e0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b8 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_e0,&local_b8)
    ;
    uVar9 = *(uint *)(field + 0x38);
  }
  switch(uVar9) {
  case 1:
    pdVar12 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar12 < 8) {
      bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e0);
      _Var16._M_p = local_e0._M_dataplus._M_p;
      if (!bVar8) {
        return false;
      }
    }
    else {
      _Var16._M_p = (pointer)*pdVar12;
      input->buffer_ = (uint8 *)(pdVar12 + 1);
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddDouble(this_00,message,field,(double)_Var16._M_p);
    }
    else {
      Reflection::SetDouble(this_00,message,field,(double)_Var16._M_p);
    }
    break;
  case 2:
    pfVar4 = (float *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
      bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e0);
      if (!bVar8) {
        return false;
      }
      fVar20 = local_e0._M_dataplus._M_p._0_4_;
    }
    else {
      fVar20 = *pfVar4;
      input->buffer_ = (uint8 *)(pfVar4 + 1);
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddFloat(this_00,message,field,fVar20);
    }
    else {
      Reflection::SetFloat(this_00,message,field,fVar20);
    }
    break;
  case 3:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) &&
       (_Var16._M_p = (pointer)(long)(char)*puVar5, -1 < (long)_Var16._M_p)) {
      pdVar12 = (double *)(puVar5 + 1);
LAB_0037d4f2:
      input->buffer_ = (uint8 *)pdVar12;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
      _Var16._M_p = (pointer)pVar21.first;
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    goto LAB_0037d87e;
  case 4:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) &&
       (_Var16._M_p = (pointer)(long)(char)*puVar5, -1 < (long)_Var16._M_p)) {
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
      _Var16._M_p = (pointer)pVar21.first;
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    iVar10 = *(int *)(field + 0x3c);
    goto joined_r0x0037d5dd;
  case 5:
    bVar8 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_e0);
LAB_0037d451:
    if (bVar8 == false) {
      return false;
    }
    uVar9 = (uint)local_e0._M_dataplus._M_p._0_4_;
    goto LAB_0037d45d;
  case 6:
    pdVar12 = (double *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)pdVar12 < 8) {
      bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e0);
      if (!bVar8) {
        return false;
      }
    }
    else {
      local_e0._M_dataplus._M_p = (pointer)*pdVar12;
      input->buffer_ = (uint8 *)(pdVar12 + 1);
    }
    iVar10 = *(int *)(field + 0x3c);
    _Var16._M_p = local_e0._M_dataplus._M_p;
joined_r0x0037d5dd:
    if (iVar10 == 3) {
      Reflection::AddUInt64(this_00,message,field,(uint64)_Var16._M_p);
    }
    else {
      Reflection::SetUInt64(this_00,message,field,(uint64)_Var16._M_p);
    }
    break;
  case 7:
    puVar5 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
      bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e0);
      goto LAB_0037d487;
    }
    local_e0._M_dataplus._M_p._0_4_ = (float)*(undefined4 *)puVar5;
    input->buffer_ = puVar5 + 4;
    goto LAB_0037d64e;
  case 8:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (uVar13 = (unsigned_long)(char)*puVar5, -1 < (long)uVar13))
    {
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar13 = pVar21.first;
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddBool(this_00,message,field,uVar13 != 0);
    }
    else {
      Reflection::SetBool(this_00,message,field,uVar13 != 0);
    }
    break;
  case 9:
    iVar10 = *(int *)(*(long *)(field + 0x28) + 0x3c);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    bVar8 = WireFormatLite::ReadBytes(input,&local_e0);
    if (!bVar8) {
LAB_0037d733:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
        return false;
      }
      operator_delete(local_e0._M_dataplus._M_p);
      return false;
    }
    if (iVar10 == 3) {
      bVar8 = WireFormatLite::VerifyUtf8String
                        (local_e0._M_dataplus._M_p,(int)local_e0._M_string_length,PARSE,
                         (char *)**(undefined8 **)(field + 8));
      if (!bVar8) goto LAB_0037d733;
    }
    if (*(int *)(field + 0x3c) == 3) {
      paVar19 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      Reflection::AddString(this_00,message,field,&local_50);
      _Var16._M_p = local_50._M_dataplus._M_p;
    }
    else {
      paVar19 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      Reflection::SetString(this_00,message,field,&local_70);
      _Var16._M_p = local_70._M_dataplus._M_p;
    }
    goto LAB_0037d934;
  case 10:
    if (*(int *)(field + 0x3c) == 3) {
      pMVar14 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar14 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar8 = WireFormatLite::ReadGroup<google::protobuf::Message>(tag >> 3,input,pMVar14);
    goto LAB_0037d791;
  case 0xb:
    if (*(int *)(field + 0x3c) == 3) {
      pMVar14 = Reflection::AddMessage(this_00,message,field,input->extension_factory_);
    }
    else {
      pMVar14 = Reflection::MutableMessage(this_00,message,field,input->extension_factory_);
    }
    bVar8 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,pMVar14);
LAB_0037d791:
    if (bVar8 == false) {
LAB_0037df5e:
      return false;
    }
    break;
  case 0xc:
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    bVar8 = WireFormatLite::ReadBytes(input,&local_e0);
    if (!bVar8) goto LAB_0037d733;
    if (*(int *)(field + 0x3c) == 3) {
      paVar19 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      Reflection::AddString(this_00,message,field,&local_90);
      _Var16._M_p = local_90._M_dataplus._M_p;
    }
    else {
      paVar19 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar19;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
      Reflection::SetString(this_00,message,field,&local_b0);
      _Var16._M_p = local_b0._M_dataplus._M_p;
    }
LAB_0037d934:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var16._M_p != paVar19) {
      operator_delete(_Var16._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    break;
  case 0xd:
    bVar8 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_e0);
LAB_0037d487:
    if (bVar8 == false) {
      return false;
    }
LAB_0037d64e:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddUInt32(this_00,message,field,(uint32)local_e0._M_dataplus._M_p._0_4_);
    }
    else {
      Reflection::SetUInt32(this_00,message,field,(uint32)local_e0._M_dataplus._M_p._0_4_);
    }
    break;
  case 0xe:
    bVar8 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_e0);
    if (!bVar8) {
      return false;
    }
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddEnumValue(this_00,message,field,(int)local_e0._M_dataplus._M_p._0_4_);
      return true;
    }
    Reflection::SetEnumValue(this_00,message,field,(int)local_e0._M_dataplus._M_p._0_4_);
    return true;
  case 0xf:
    puVar3 = (uint *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
      bVar8 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_e0);
      goto LAB_0037d451;
    }
    uVar9 = *puVar3;
    input->buffer_ = (uint8 *)(puVar3 + 1);
    goto LAB_0037d45d;
  case 0x10:
    pdVar12 = (double *)input->buffer_;
    if (7 < *(int *)&input->buffer_end_ - (int)pdVar12) {
      _Var16._M_p = (pointer)*pdVar12;
      pdVar12 = pdVar12 + 1;
      goto LAB_0037d4f2;
    }
    bVar8 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_e0);
    _Var16._M_p = local_e0._M_dataplus._M_p;
    if (!bVar8) {
      return false;
    }
    goto LAB_0037d87e;
  case 0x11:
    bVar8 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&local_e0);
    if (!bVar8) {
      return false;
    }
    uVar9 = -((uint)local_e0._M_dataplus._M_p._0_4_ & 1) ^
            (uint)local_e0._M_dataplus._M_p._0_4_ >> 1;
LAB_0037d45d:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt32(this_00,message,field,uVar9);
    }
    else {
      Reflection::SetInt32(this_00,message,field,uVar9);
    }
    break;
  case 0x12:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (uVar17 = (ulong)(char)*puVar5, -1 < (long)uVar17)) {
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar21 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar17 = pVar21.first;
      if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    _Var16._M_p = (pointer)(-(ulong)((uint)uVar17 & 1) ^ uVar17 >> 1);
LAB_0037d87e:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::AddInt64(this_00,message,field,(int64)_Var16._M_p);
    }
    else {
      Reflection::SetInt64(this_00,message,field,(int64)_Var16._M_p);
    }
  }
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32 tag,
    const FieldDescriptor* field,  // May be NULL for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == NULL) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32 length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32, Int32)
      HANDLE_PACKED_TYPE(INT64, int64, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != NULL) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64 sign_extended_value = static_cast<int64>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32, Int32)
      HANDLE_TYPE(INT64, int64, Int64)
      HANDLE_TYPE(SINT32, int32, Int32)
      HANDLE_TYPE(SINT64, int64, Int64)
      HANDLE_TYPE(UINT32, uint32, UInt32)
      HANDLE_TYPE(UINT64, uint64, UInt64)

      HANDLE_TYPE(FIXED32, uint32, UInt32)
      HANDLE_TYPE(FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32, int32, Int32)
      HANDLE_TYPE(SFIXED64, int64, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}